

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_creader_set(Curl_easy *data,Curl_creader *r)

{
  Curl_creader *pCVar1;
  CURLcode CVar2;
  
  pCVar1 = (data->req).reader_stack;
  while (pCVar1 != (Curl_creader *)0x0) {
    (data->req).reader_stack = pCVar1->next;
    (*pCVar1->crt->do_close)(data,pCVar1);
    (*Curl_cfree)(pCVar1);
    pCVar1 = (data->req).reader_stack;
  }
  CVar2 = do_init_reader_stack(data,r);
  if (r != (Curl_creader *)0x0 && CVar2 != CURLE_OK) {
    (*r->crt->do_close)(data,r);
    (*Curl_cfree)(r);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_creader_set(struct Curl_easy *data, struct Curl_creader *r)
{
  CURLcode result;

  DEBUGASSERT(r);
  DEBUGASSERT(r->crt);
  DEBUGASSERT(r->phase == CURL_CR_CLIENT);

  cl_reset_reader(data);
  result = do_init_reader_stack(data, r);
  if(result)
    Curl_creader_free(data, r);
  return result;
}